

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picture_tools_enc.c
# Opt level: O3

void WebPBlendAlpha(WebPPicture *pic,uint32_t background_rgb)

{
  byte bVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint8_t *puVar6;
  uint uVar7;
  uint8_t *puVar8;
  uint uVar9;
  int iVar10;
  uint32_t *puVar11;
  int iVar12;
  uint uVar13;
  long lVar14;
  uint8_t *puVar15;
  uint uVar16;
  uint8_t *puVar17;
  ulong uVar18;
  uint8_t *__s;
  uint uVar19;
  
  if (pic != (WebPPicture *)0x0) {
    uVar4 = background_rgb >> 0x10 & 0xff;
    uVar5 = background_rgb >> 8 & 0xff;
    uVar2 = background_rgb & 0xff;
    if (pic->use_argb == 0) {
      __s = pic->a;
      if (((__s != (uint8_t *)0x0 & (byte)(char)pic->colorspace >> 2) == 1) && (0 < pic->height)) {
        uVar19 = pic->width >> 1;
        uVar16 = uVar5 * -0x12a24 + 0x2020000 + uVar2 * 0x1c200 + uVar4 * -0x97dc >> 0x12;
        uVar13 = uVar5 * -0x178d0 + 0x2020000 + uVar2 * -0x4930 + uVar4 * 0x1c200 >> 0x12;
        puVar8 = pic->y;
        puVar15 = pic->u;
        puVar17 = pic->v;
        uVar9 = 0;
        do {
          uVar3 = pic->width;
          if (0 < (int)uVar3) {
            lVar14 = 0;
            do {
              bVar1 = __s[lVar14];
              if (bVar1 != 0xff) {
                puVar8[lVar14] =
                     (uint8_t)(((uint)puVar8[lVar14] * (uint)bVar1 +
                               (bVar1 ^ 0xff) *
                               (uVar5 * 0x8123 + uVar2 * 0x1914 + uVar4 * 0x41c7 + 0x108000 >> 0x10)
                               ) * 0x101 + 0x100 >> 0x10);
                uVar3 = pic->width;
              }
              lVar14 = lVar14 + 1;
            } while (lVar14 < (int)uVar3);
          }
          if ((uVar9 & 1) == 0) {
            puVar6 = __s;
            if ((uVar9 | 1) != pic->height) {
              puVar6 = __s + pic->a_stride;
            }
            if ((int)uVar19 < 1) {
              uVar7 = 0;
            }
            else {
              uVar18 = 0;
              do {
                iVar10 = (uint)puVar6[uVar18 * 2 + 1] + (uint)puVar6[uVar18 * 2] +
                         (uint)__s[uVar18 * 2 + 1] + (uint)__s[uVar18 * 2];
                puVar15[uVar18] =
                     (uint8_t)(((uint)puVar15[uVar18] * iVar10 + (0x3fc - iVar10) * uVar16) * 0x101
                               + 0x400 >> 0x12);
                puVar17[uVar18] =
                     (uint8_t)(((uint)puVar17[uVar18] * iVar10 + (0x3fc - iVar10) * uVar13) * 0x101
                               + 0x400 >> 0x12);
                uVar18 = uVar18 + 1;
              } while (uVar19 != uVar18);
              uVar3 = pic->width;
              uVar7 = uVar19;
            }
            if ((uVar3 & 1) != 0) {
              uVar18 = (ulong)uVar7;
              iVar10 = ((uint)puVar6[uVar18 * 2] + (uint)__s[uVar18 * 2]) * 2;
              iVar12 = ((uint)puVar6[uVar18 * 2] + (uint)__s[uVar18 * 2]) * -2 + 0x3fc;
              puVar15[uVar18] =
                   (uint8_t)(((uint)puVar15[uVar18] * iVar10 + iVar12 * uVar16) * 0x101 + 0x400 >>
                            0x12);
              puVar17[uVar18] =
                   (uint8_t)(((uint)puVar17[uVar18] * iVar10 + iVar12 * uVar13) * 0x101 + 0x400 >>
                            0x12);
              uVar3 = pic->width;
            }
          }
          else {
            puVar15 = puVar15 + pic->uv_stride;
            puVar17 = puVar17 + pic->uv_stride;
          }
          memset(__s,0xff,(long)(int)uVar3);
          __s = __s + pic->a_stride;
          puVar8 = puVar8 + pic->y_stride;
          uVar9 = uVar9 + 1;
        } while ((int)uVar9 < pic->height);
      }
    }
    else {
      iVar10 = pic->height;
      if (0 < iVar10) {
        puVar11 = pic->argb;
        uVar18 = (ulong)(uint)pic->width;
        iVar12 = 0;
        do {
          if (0 < (int)uVar18) {
            lVar14 = 0;
            do {
              uVar9 = puVar11[lVar14];
              uVar19 = uVar9 >> 0x18;
              if (uVar19 != 0xff) {
                uVar16 = uVar5 << 8 | uVar4 << 0x10 | uVar2;
                if (0xffffff < uVar9) {
                  uVar16 = uVar19 ^ 0xff;
                  uVar16 = ((uVar9 >> 8 & 0xff) * uVar19 + uVar16 * uVar5) * 0x101 + 0x100 >> 8 &
                           0xffff00 |
                           ((uVar9 & 0xff) * uVar19 + uVar16 * uVar2) * 0x101 + 0x100 >> 0x10 |
                           ((uVar9 >> 0x10 & 0xff) * uVar19 + uVar16 * uVar4) * 0x101 + 0x100 &
                           0xff0000;
                }
                puVar11[lVar14] = uVar16 | 0xff000000;
              }
              lVar14 = lVar14 + 1;
              uVar18 = (ulong)pic->width;
            } while (lVar14 < (long)uVar18);
            iVar10 = pic->height;
          }
          puVar11 = puVar11 + pic->argb_stride;
          iVar12 = iVar12 + 1;
        } while (iVar12 < iVar10);
      }
    }
  }
  return;
}

Assistant:

void WebPBlendAlpha(WebPPicture* pic, uint32_t background_rgb) {
  const int red = (background_rgb >> 16) & 0xff;
  const int green = (background_rgb >> 8) & 0xff;
  const int blue = (background_rgb >> 0) & 0xff;
  int x, y;
  if (pic == NULL) return;
  if (!pic->use_argb) {
    const int uv_width = (pic->width >> 1);  // omit last pixel during u/v loop
    const int Y0 = VP8RGBToY(red, green, blue, YUV_HALF);
    // VP8RGBToU/V expects the u/v values summed over four pixels
    const int U0 = VP8RGBToU(4 * red, 4 * green, 4 * blue, 4 * YUV_HALF);
    const int V0 = VP8RGBToV(4 * red, 4 * green, 4 * blue, 4 * YUV_HALF);
    const int has_alpha = pic->colorspace & WEBP_CSP_ALPHA_BIT;
    uint8_t* y_ptr = pic->y;
    uint8_t* u_ptr = pic->u;
    uint8_t* v_ptr = pic->v;
    uint8_t* a_ptr = pic->a;
    if (!has_alpha || a_ptr == NULL) return;    // nothing to do
    for (y = 0; y < pic->height; ++y) {
      // Luma blending
      for (x = 0; x < pic->width; ++x) {
        const uint8_t alpha = a_ptr[x];
        if (alpha < 0xff) {
          y_ptr[x] = BLEND(Y0, y_ptr[x], alpha);
        }
      }
      // Chroma blending every even line
      if ((y & 1) == 0) {
        uint8_t* const a_ptr2 =
            (y + 1 == pic->height) ? a_ptr : a_ptr + pic->a_stride;
        for (x = 0; x < uv_width; ++x) {
          // Average four alpha values into a single blending weight.
          // TODO(skal): might lead to visible contouring. Can we do better?
          const uint32_t alpha =
              a_ptr[2 * x + 0] + a_ptr[2 * x + 1] +
              a_ptr2[2 * x + 0] + a_ptr2[2 * x + 1];
          u_ptr[x] = BLEND_10BIT(U0, u_ptr[x], alpha);
          v_ptr[x] = BLEND_10BIT(V0, v_ptr[x], alpha);
        }
        if (pic->width & 1) {   // rightmost pixel
          const uint32_t alpha = 2 * (a_ptr[2 * x + 0] + a_ptr2[2 * x + 0]);
          u_ptr[x] = BLEND_10BIT(U0, u_ptr[x], alpha);
          v_ptr[x] = BLEND_10BIT(V0, v_ptr[x], alpha);
        }
      } else {
        u_ptr += pic->uv_stride;
        v_ptr += pic->uv_stride;
      }
      memset(a_ptr, 0xff, pic->width);  // reset alpha value to opaque
      a_ptr += pic->a_stride;
      y_ptr += pic->y_stride;
    }
  } else {
    uint32_t* argb = pic->argb;
    const uint32_t background = MakeARGB32(red, green, blue);
    for (y = 0; y < pic->height; ++y) {
      for (x = 0; x < pic->width; ++x) {
        const int alpha = (argb[x] >> 24) & 0xff;
        if (alpha != 0xff) {
          if (alpha > 0) {
            int r = (argb[x] >> 16) & 0xff;
            int g = (argb[x] >>  8) & 0xff;
            int b = (argb[x] >>  0) & 0xff;
            r = BLEND(red, r, alpha);
            g = BLEND(green, g, alpha);
            b = BLEND(blue, b, alpha);
            argb[x] = MakeARGB32(r, g, b);
          } else {
            argb[x] = background;
          }
        }
      }
      argb += pic->argb_stride;
    }
  }
}